

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::analysis::Matrix::IsSameImpl(Matrix *this,Type *that,IsSameCache *seen)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar2 = (*that->_vptr_Type[0x10])(that);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if ((lVar3 != 0) && (this->count_ == *(uint32_t *)(lVar3 + 0x30))) {
    iVar2 = (*this->element_type_->_vptr_Type[2])
                      (this->element_type_,*(undefined8 *)(lVar3 + 0x28),seen);
    if ((char)iVar2 != '\0') {
      bVar1 = Type::HasSameDecorations(&this->super_Type,that);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Matrix::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Matrix* mt = that->AsMatrix();
  if (!mt) return false;
  return count_ == mt->count_ &&
         element_type_->IsSameImpl(mt->element_type_, seen) &&
         HasSameDecorations(that);
}